

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QtFontStyle * bestStyle(QtFontFoundry *foundry,Key *styleKey,QString *styleName)

{
  bool bVar1;
  int iVar2;
  ushort *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int d;
  QtFontStyle *style;
  int i;
  int dist;
  int best;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff78;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  QMessageLogger *in_stack_ffffffffffffff90;
  int local_64;
  uint local_60;
  int local_5c;
  char local_40 [32];
  int local_20;
  int local_1c;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c = 0;
  local_60 = 0xffff;
  local_64 = 0;
  do {
    if (*(int *)(in_RDI + 0x18) <= local_64) {
LAB_00740083:
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = 0xaa;
      uStack_f = 0xaaaaaaaaaaaaaa;
      QtPrivateLogging::lcFontMatch();
      anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
        anon_unknown.dwarf_10ff5f8::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x7400c7);
        QMessageLogger::QMessageLogger
                  (in_stack_ffffffffffffff90,
                   (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(char *)in_stack_ffffffffffffff78
                   ,(char *)0x7400dd);
        QMessageLogger::debug(local_40,"          best style has distance 0x%x",(ulong)local_60);
        local_10 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return *(QtFontStyle **)(*(long *)(in_RDI + 0x20) + (long)local_5c * 8);
    }
    in_stack_ffffffffffffff90 = *(QMessageLogger **)(*(long *)(in_RDI + 0x20) + (long)local_64 * 8);
    bVar1 = QString::isEmpty((QString *)0x73ff12);
    if ((!bVar1) &&
       (bVar1 = operator==((QString *)in_stack_ffffffffffffff80,(QString *)in_stack_ffffffffffffff78
                          ), bVar1)) {
      local_60 = 0;
      local_5c = local_64;
      goto LAB_00740083;
    }
    local_1c = (int)((*in_RSI >> 2 & 0x3ff) -
                    ((ushort)((ushort)(in_stack_ffffffffffffff90->context).version >> 2) & 0x3ff)) /
               10;
    in_stack_ffffffffffffff8c = qAbs<int>(&local_1c);
    if ((*(int3 *)in_RSI >> 0xc != 0) &&
       ((int3)((int3)(in_stack_ffffffffffffff90->context).version >> 0xc) != 0)) {
      local_20 = ((int)*(int3 *)in_RSI >> 0xc) -
                 ((int)(int3)(in_stack_ffffffffffffff90->context).version >> 0xc);
      iVar2 = qAbs<int>(&local_20);
      in_stack_ffffffffffffff8c = iVar2 + in_stack_ffffffffffffff8c;
    }
    if ((*in_RSI & 3) != ((ushort)(in_stack_ffffffffffffff90->context).version & 3)) {
      if (((*in_RSI & 3) == 0) || (((in_stack_ffffffffffffff90->context).version & 3) == 0)) {
        in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 0x1000;
      }
      else {
        in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1;
      }
    }
    if ((int)in_stack_ffffffffffffff8c < (int)local_60) {
      local_5c = local_64;
      local_60 = in_stack_ffffffffffffff8c;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

static QtFontStyle *bestStyle(QtFontFoundry *foundry, const QtFontStyle::Key &styleKey,
                              const QString &styleName = QString())
{
    int best = 0;
    int dist = 0xffff;

    for ( int i = 0; i < foundry->count; i++ ) {
        QtFontStyle *style = foundry->styles[i];

        if (!styleName.isEmpty() && styleName == style->styleName) {
            dist = 0;
            best = i;
            break;
        }

        int d = qAbs( (int(styleKey.weight) - int(style->key.weight)) / 10 );

        if ( styleKey.stretch != 0 && style->key.stretch != 0 ) {
            d += qAbs( styleKey.stretch - style->key.stretch );
        }

        if (styleKey.style != style->key.style) {
            if (styleKey.style != QFont::StyleNormal && style->key.style != QFont::StyleNormal)
                // one is italic, the other oblique
                d += 0x0001;
            else
                d += 0x1000;
        }

        if ( d < dist ) {
            best = i;
            dist = d;
        }
    }

    qCDebug(lcFontMatch,  "          best style has distance 0x%x", dist );
    return foundry->styles[best];
}